

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# navigationbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::NavigationBar::showScreen(NavigationBar *this,QWidget *s)

{
  QStackedWidget *pQVar1;
  NavigationButton *pNVar2;
  TextLabel *this_00;
  QWidget *pQVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  NavigationBarPrivate *pNVar7;
  QSharedPointer<QtMWidgets::NavigationItem> *pQVar8;
  NavigationBarPrivate *pNVar9;
  int *piVar10;
  NavigationItem *text;
  QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
  *this_01;
  int local_50 [4];
  QWidget *local_40;
  undefined1 local_38 [8];
  QSharedPointer<QtMWidgets::NavigationItem> currentItem;
  QSharedPointer<QtMWidgets::NavigationItem> nextItem;
  QWidget *s_local;
  NavigationBar *this_local;
  
  nextItem.d = (Data *)s;
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  bVar4 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::contains
                    (&pNVar7->itemsMap,(QWidget **)&nextItem.d);
  if (!bVar4) {
    return;
  }
  iVar5 = currentIndex(this);
  if (iVar5 == -1) {
    return;
  }
  this_01 = &this->d;
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(this_01);
  pQVar8 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&pNVar7->itemsMap,(QWidget **)&nextItem.d);
  QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer
            ((QSharedPointer<QtMWidgets::NavigationItem> *)&currentItem.d,pQVar8);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(this_01);
  pNVar9 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(this_01);
  pQVar1 = pNVar9->stack;
  currentIndex(this);
  local_40 = (QWidget *)QStackedWidget::widget((int)pQVar1);
  pQVar8 = QMap<QWidget_*,_QSharedPointer<QtMWidgets::NavigationItem>_>::operator[]
                     (&pNVar7->itemsMap,&local_40);
  QSharedPointer<QtMWidgets::NavigationItem>::QSharedPointer
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_38,pQVar8);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  bVar4 = QList<int>::isEmpty(&(pNVar7->backStack).super_QList<int>);
  if (!bVar4) {
    pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
             ::operator->(&this->d);
    piVar10 = QStack<int>::top(&pNVar7->backStack);
    iVar5 = *piVar10;
    iVar6 = currentIndex(this);
    if (iVar5 == iVar6) goto LAB_001df324;
  }
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  local_50[0] = currentIndex(this);
  QStack<int>::push(&pNVar7->backStack,local_50);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  pNVar2 = pNVar7->left;
  QSharedPointer<QtMWidgets::NavigationItem>::operator->
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_38);
  QAbstractButton::setText((QString *)pNVar2);
  QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
  ::operator->(&this->d);
  QWidget::show();
LAB_001df324:
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  QList<int>::clear(&(pNVar7->forwardStack).super_QList<int>);
  QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
  ::operator->(&this->d);
  QWidget::hide();
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  this_00 = pNVar7->title;
  text = QSharedPointer<QtMWidgets::NavigationItem>::operator->
                   ((QSharedPointer<QtMWidgets::NavigationItem> *)&currentItem.d);
  TextLabel::setText(this_00,&text->title);
  pNVar7 = QScopedPointer<QtMWidgets::NavigationBarPrivate,_QScopedPointerDeleter<QtMWidgets::NavigationBarPrivate>_>
           ::operator->(&this->d);
  pQVar3 = (QWidget *)pNVar7->stack;
  QSharedPointer<QtMWidgets::NavigationItem>::operator->
            ((QSharedPointer<QtMWidgets::NavigationItem> *)&currentItem.d);
  QStackedWidget::setCurrentWidget(pQVar3);
  QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
            ((QSharedPointer<QtMWidgets::NavigationItem> *)local_38);
  QSharedPointer<QtMWidgets::NavigationItem>::~QSharedPointer
            ((QSharedPointer<QtMWidgets::NavigationItem> *)&currentItem.d);
  return;
}

Assistant:

void
NavigationBar::showScreen( QWidget * s )
{
	if( d->itemsMap.contains( s ) && currentIndex() != -1 )
	{
		QSharedPointer< NavigationItem > nextItem = d->itemsMap[ s ];
		QSharedPointer< NavigationItem > currentItem =
			d->itemsMap[ d->stack->widget( currentIndex() ) ];

		if( d->backStack.isEmpty() || d->backStack.top() != currentIndex() )
		{
			d->backStack.push( currentIndex() );

			d->left->setText( currentItem->title );
			d->left->show();
		}

		d->forwardStack.clear();
		d->right->hide();

		d->title->setText( nextItem->title );

		d->stack->setCurrentWidget( nextItem->self );
	}
}